

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressStream_simpleArgs
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos)

{
  size_t sVar1;
  size_t sVar2;
  size_t cErr;
  ZSTD_inBuffer input;
  ZSTD_outBuffer output;
  size_t srcSize_local;
  void *src_local;
  size_t *dstPos_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  sVar1 = *dstPos;
  input.size = *srcPos;
  cErr = (size_t)src;
  input.src = (void *)srcSize;
  input.pos = (size_t)dst;
  sVar2 = ZSTD_decompressStream(dctx,(ZSTD_outBuffer *)&input.pos,(ZSTD_inBuffer *)&cErr);
  *dstPos = sVar1;
  *srcPos = input.size;
  return sVar2;
}

Assistant:

size_t ZSTD_decompressStream_simpleArgs (
                            ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos)
{
    ZSTD_outBuffer output = { dst, dstCapacity, *dstPos };
    ZSTD_inBuffer  input  = { src, srcSize, *srcPos };
    /* ZSTD_compress_generic() will check validity of dstPos and srcPos */
    size_t const cErr = ZSTD_decompressStream(dctx, &output, &input);
    *dstPos = output.pos;
    *srcPos = input.pos;
    return cErr;
}